

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_vtab_config(sqlite3 *db,int op,...)

{
  u8 in_DL;
  undefined8 uVar1;
  int iVar2;
  va_list ap;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  uVar1 = 0x197a8;
  if (op == 1) {
    if (db->pVtabCtx != (VtabCtx *)0x0) {
      db->pVtabCtx->pVTable->bConstraint = in_DL;
      iVar2 = 0;
      goto LAB_001258e6;
    }
    uVar1 = 0x197a0;
  }
  iVar2 = 0x15;
  sqlite3_log(0x15,"misuse at line %d of [%.10s]",uVar1,"118a3b35693b134d56ebd780123b7fd6f1497668");
  sqlite3Error(db,0x15,(char *)0x0);
LAB_001258e6:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_vtab_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc = SQLITE_OK;

  sqlite3_mutex_enter(db->mutex);

  va_start(ap, op);
  switch( op ){
    case SQLITE_VTAB_CONSTRAINT_SUPPORT: {
      VtabCtx *p = db->pVtabCtx;
      if( !p ){
        rc = SQLITE_MISUSE_BKPT;
      }else{
        assert( p->pTab==0 || (p->pTab->tabFlags & TF_Virtual)!=0 );
        p->pVTable->bConstraint = (u8)va_arg(ap, int);
      }
      break;
    }
    default:
      rc = SQLITE_MISUSE_BKPT;
      break;
  }
  va_end(ap);

  if( rc!=SQLITE_OK ) sqlite3Error(db, rc, 0);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}